

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

void __thiscall
node::anon_unknown_2::ChainImpl::requestMempoolTransactions
          (ChainImpl *this,Notifications *notifications)

{
  pointer prVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_68;
  unique_lock<std::recursive_mutex> local_50;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_node->mempool)._M_t.
      super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl != (CTxMemPool *)0x0) {
    local_40._M_device = &cs_main.super_recursive_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_40);
    local_50._M_device =
         &(((this->m_node->mempool)._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs).super_recursive_mutex;
    local_50._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_50);
    CTxMemPool::entryAll
              (&local_68,
               (this->m_node->mempool)._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
    for (prVar1 = local_68.
                  super__Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        prVar1 != local_68.
                  super__Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; prVar1 = prVar1 + 1) {
      local_78 = (prVar1->_M_data->tx).
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70 = (prVar1->_M_data->tx).
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_70->_M_use_count = local_70->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_70->_M_use_count = local_70->_M_use_count + 1;
        }
      }
      (*notifications->_vptr_Notifications[2])(notifications,&local_78);
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
    }
    if (local_68.
        super__Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void requestMempoolTransactions(Notifications& notifications) override
    {
        if (!m_node.mempool) return;
        LOCK2(::cs_main, m_node.mempool->cs);
        for (const CTxMemPoolEntry& entry : m_node.mempool->entryAll()) {
            notifications.transactionAddedToMempool(entry.GetSharedTx());
        }
    }